

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O2

void __thiscall soul::heart::Parser::parseFunctionParams(Parser *this,Function *f)

{
  bool bVar1;
  IntrinsicType IVar2;
  Module *this_00;
  char *extraout_RDX;
  string_view s;
  Role local_e4;
  string intrin;
  pool_ref<soul::heart::Variable> local_c0;
  CodeLocation paramLocation;
  Identifier name;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  FunctionParseState state;
  
  state.blocks.
  super__Vector_base<soul::FunctionParseState::BlockCode,_std::allocator<soul::FunctionParseState::BlockCode>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  state.blocks.
  super__Vector_base<soul::FunctionParseState::BlockCode,_std::allocator<soul::FunctionParseState::BlockCode>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  state.blocks.
  super__Vector_base<soul::FunctionParseState::BlockCode,_std::allocator<soul::FunctionParseState::BlockCode>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  state.variables.
  super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  state.variables.
  super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  state.variables.
  super__Vector_base<soul::pool_ref<soul::heart::Variable>,_std::allocator<soul::pool_ref<soul::heart::Variable>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  state.currentBlock = (BlockCode *)0x0;
  state.function = f;
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x299119);
  if (!bVar1) {
    while( true ) {
      readValueOrRefType((Type *)&intrin,this);
      paramLocation.sourceCode.object =
           (this->
           super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
           ).location.sourceCode.object;
      if (paramLocation.sourceCode.object != (SourceCodeText *)0x0) {
        ((paramLocation.sourceCode.object)->super_RefCountedObject).refCount =
             ((paramLocation.sourceCode.object)->super_RefCountedObject).refCount + 1;
      }
      paramLocation.location.data =
           (this->
           super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
           ).location.location.data;
      name = parseVariableIdentifier(this);
      this_00 = pool_ptr<soul::Module>::operator->(&this->module);
      local_e4 = parameter;
      local_c0.object =
           Module::
           allocate<soul::heart::Variable,soul::CodeLocation,soul::Type&,soul::Identifier&,soul::heart::Variable::Role>
                     (this_00,&paramLocation,(Type *)&intrin,&name,&local_e4);
      ArrayWithPreallocation<soul::pool_ref<soul::heart::Variable>,_4UL>::push_back
                (&f->parameters,&local_c0);
      bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ::matchIf<soul::TokenType>
                        (&this->
                          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                         ,(TokenType)0x275d9e);
      if (!bVar1) break;
      RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&paramLocation.sourceCode);
      RefCountedPtr<soul::Structure>::~RefCountedPtr
                ((RefCountedPtr<soul::Structure> *)&intrin.field_2._M_allocated_capacity);
    }
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    expect<soul::TokenType>
              (&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ,(TokenType)0x299119);
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&paramLocation.sourceCode);
    RefCountedPtr<soul::Structure>::~RefCountedPtr
              ((RefCountedPtr<soul::Structure> *)&intrin.field_2._M_allocated_capacity);
  }
  if ((f->functionType).type != event) {
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    expect<soul::TokenType>
              (&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ,(TokenType)0x275fc2);
    readValueType((Type *)&intrin,this);
    Type::operator=(&f->returnType,(Type *)&intrin);
    RefCountedPtr<soul::Structure>::~RefCountedPtr
              ((RefCountedPtr<soul::Structure> *)&intrin.field_2._M_allocated_capacity);
  }
  parseAnnotation(this,&f->annotation);
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x2743e3);
  if (!bVar1) {
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    expect<soul::TokenType>
              (&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ,(TokenType)0x275da0);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&paramLocation,"intrin",(allocator<char> *)&local_c0);
  name.name = (string *)&local_80;
  local_80._M_local_buf[0] = '\0';
  Annotation::getString(&intrin,&f->annotation,(string *)&paramLocation,(string *)&name);
  std::__cxx11::string::~string((string *)&name);
  std::__cxx11::string::~string((string *)&paramLocation);
  if (intrin._M_string_length != 0) {
    s._M_str = extraout_RDX;
    s._M_len = (size_t)intrin._M_dataplus._M_p;
    IVar2 = getIntrinsicTypeFromName((soul *)intrin._M_string_length,s);
    f->intrinsicType = IVar2;
    FunctionType::operator=(&f->functionType,(FunctionType)0x5);
  }
  std::__cxx11::string::~string((string *)&intrin);
  FunctionParseState::~FunctionParseState(&state);
  return;
}

Assistant:

void parseFunctionParams (heart::Function& f)
    {
        FunctionParseState state (f);

        if (! matchIf (HEARTOperator::closeParen))
        {
            for (;;)
            {
                auto type = readValueOrRefType();
                auto paramLocation = location;
                auto name = parseVariableIdentifier();
                f.parameters.push_back (module->allocate<heart::Variable> (std::move (paramLocation), type, name,
                                                                           heart::Variable::Role::parameter));

                if (matchIf (HEARTOperator::comma))
                    continue;

                expect (HEARTOperator::closeParen);
                break;
            }
        }

        if (! f.functionType.isEvent())
        {
            expect (HEARTOperator::rightArrow);
            f.returnType = readValueType();
        }

        parseAnnotation (f.annotation);

        if (! matchIf (HEARTOperator::semicolon))
            expect (HEARTOperator::openBrace);

        auto intrin = f.annotation.getString ("intrin");

        if (! intrin.empty())
        {
            f.intrinsicType = getIntrinsicTypeFromName (intrin);
            f.functionType = heart::FunctionType::intrinsic();
        }
    }